

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

ContentSpecNode *
xercesc_4_0::makeRepNode(XMLCh testCh,ContentSpecNode *prevNode,MemoryManager *manager)

{
  NodeTypes NVar1;
  ContentSpecNode *pCVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,testCh);
  if (iVar3 == 0x2a) {
    NVar1 = ZeroOrMore;
  }
  else if (iVar3 == 0x3f) {
    NVar1 = ZeroOrOne;
  }
  else {
    if (iVar3 != 0x2b) {
      return prevNode;
    }
    NVar1 = OneOrMore;
  }
  pCVar2 = (ContentSpecNode *)XMemory::operator_new(0x40,manager);
  (pCVar2->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__ContentSpecNode_00404df0;
  pCVar2->fMemoryManager = manager;
  pCVar2->fElement = (QName *)0x0;
  pCVar2->fElementDecl = (XMLElementDecl *)0x0;
  pCVar2->fFirst = prevNode;
  pCVar2->fSecond = (ContentSpecNode *)0x0;
  pCVar2->fType = NVar1;
  pCVar2->fAdoptFirst = true;
  pCVar2->fAdoptSecond = true;
  pCVar2->fMinOccurs = 1;
  pCVar2->fMaxOccurs = 1;
  return pCVar2;
}

Assistant:

static ContentSpecNode* makeRepNode(const XMLCh testCh,
                                    ContentSpecNode* const prevNode,
                                    MemoryManager* const manager)
{
    if (testCh == chQuestion)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrOne
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chPlus)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::OneOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chAsterisk)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }

    // Just return the incoming node
    return prevNode;
}